

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O1

void __thiscall
CryptoUtil_EncryptAes256KeyLengthError_Test::~CryptoUtil_EncryptAes256KeyLengthError_Test
          (CryptoUtil_EncryptAes256KeyLengthError_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, EncryptAes256KeyLengthError) {
  try {
    ByteData key("0123456789abcdef");
    ByteData byte_data = CryptoUtil::EncryptAes256(
        key.GetBytes(), "aiueoaiueoaiueoaiueoaiueoaiueoai");
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "EncryptAes256 key size error.");
    return;
  }
  ASSERT_TRUE(false);
}